

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O0

SampledSpectrum __thiscall pbrt::Vertex::f(Vertex *this,Vertex *next,TransportMode mode)

{
  undefined8 uVar1;
  array<float,_4> aVar2;
  Vector3f wiRender;
  TransportMode in_EDX;
  BSDF *in_RSI;
  Point3<float> *in_RDI;
  float fVar3;
  undefined1 in_ZMM0 [64];
  undefined1 auVar9 [56];
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 extraout_var [56];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  float fVar10;
  float fVar11;
  undefined1 auVar13 [56];
  undefined1 auVar12 [64];
  Point3f PVar14;
  Vector3<float> VVar15;
  SampledSpectrum SVar16;
  float unaff_retaddr;
  Tuple3<pbrt::Vector3,_float> in_stack_00000018;
  Vector3f wi;
  Float in_stack_ffffffffffffff0c;
  undefined4 in_stack_ffffffffffffff10;
  Vertex *in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  Vector3<float> *in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffffac;
  LogLevel line;
  undefined4 in_stack_ffffffffffffffbc;
  LogLevel level;
  Tuple3<pbrt::Vector3,_float> local_30;
  undefined8 local_10;
  undefined8 in_stack_fffffffffffffff8;
  
  auVar9 = in_ZMM0._8_56_;
  PVar14 = p(in_stack_ffffffffffffff20);
  fVar10 = PVar14.super_Tuple3<pbrt::Point3,_float>.z;
  auVar4._0_8_ = PVar14.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar4._8_56_ = auVar9;
  uVar1 = vmovlpd_avx(auVar4._0_16_);
  line = (LogLevel)((ulong)uVar1 >> 0x20);
  level = line;
  PVar14 = p(in_stack_ffffffffffffff20);
  fVar11 = PVar14.super_Tuple3<pbrt::Point3,_float>.z;
  auVar5._0_8_ = PVar14.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar5._8_56_ = auVar9;
  vmovlpd_avx(auVar5._0_16_);
  VVar15 = Point3<float>::operator-((Point3<float> *)in_stack_ffffffffffffff20,in_RDI);
  local_30.z = VVar15.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar6._0_8_ = VVar15.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar6._8_56_ = auVar9;
  local_30._0_8_ = vmovlpd_avx(auVar6._0_16_);
  fVar3 = LengthSquared<float>((Vector3<float> *)&local_30);
  if ((fVar3 != 0.0) || (NAN(fVar3))) {
    auVar9 = extraout_var;
    VVar15 = Normalize<float>(in_stack_ffffffffffffff30);
    local_30.z = VVar15.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar7._0_8_ = VVar15.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar7._8_56_ = auVar9;
    local_30._0_8_ = vmovlpd_avx(auVar7._0_16_);
    fVar3 = (in_RDI->super_Tuple3<pbrt::Point3,_float>).x;
    if (fVar3 == 2.8026e-45) {
      auVar9 = ZEXT856(0);
      auVar13 = (undefined1  [56])0x0;
      wiRender.super_Tuple3<pbrt::Vector3,_float>.z = unaff_retaddr;
      wiRender.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)in_stack_fffffffffffffff8;
      wiRender.super_Tuple3<pbrt::Vector3,_float>.y =
           (float)(int)((ulong)in_stack_fffffffffffffff8 >> 0x20);
      SVar16 = BSDF::f(in_RSI,(Vector3f)in_stack_00000018,wiRender,in_EDX);
      auVar12._0_8_ = SVar16.values.values._8_8_;
      auVar12._8_56_ = auVar13;
      auVar8._0_8_ = SVar16.values.values._0_8_;
      auVar8._8_56_ = auVar9;
      local_10 = vmovlpd_avx(auVar8._0_16_);
      in_stack_fffffffffffffff8 = vmovlpd_avx(auVar12._0_16_);
    }
    else {
      if (fVar3 != 4.2039e-45) {
        LogFatal(level,(char *)CONCAT44(in_stack_ffffffffffffffbc,fVar10),line,
                 (char *)CONCAT44(in_stack_ffffffffffffffac,fVar11));
      }
      PhaseFunctionHandle::p
                ((PhaseFunctionHandle *)in_stack_ffffffffffffff30,
                 (Vector3f *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                 (Vector3f *)in_stack_ffffffffffffff20);
      SampledSpectrum::SampledSpectrum
                ((SampledSpectrum *)CONCAT44(fVar3,in_stack_ffffffffffffff10),
                 in_stack_ffffffffffffff0c);
    }
  }
  else {
    memset(&local_10,0,0x10);
    SampledSpectrum::SampledSpectrum((SampledSpectrum *)0x81a3fb);
  }
  aVar2.values[2] = (float)(int)in_stack_fffffffffffffff8;
  aVar2.values[3] = (float)(int)((ulong)in_stack_fffffffffffffff8 >> 0x20);
  aVar2.values[0] = (float)(undefined4)local_10;
  aVar2.values[1] = (float)local_10._4_4_;
  return (array<float,_4>)(array<float,_4>)aVar2.values;
}

Assistant:

SampledSpectrum f(const Vertex &next, TransportMode mode) const {
        Vector3f wi = next.p() - p();
        if (LengthSquared(wi) == 0)
            return {};
        wi = Normalize(wi);
        switch (type) {
        case VertexType::Surface:
            return bsdf.f(si.wo, wi, mode);
        case VertexType::Medium:
            return SampledSpectrum(mi.phase.p(mi.wo, wi));
        default:
            LOG_FATAL("Vertex::f(): Unimplemented");
            return SampledSpectrum(0.f);
        }
    }